

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rownumber_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowNtileExecutor::EvaluateInternal
          (WindowNtileExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  long lVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  reference pvVar4;
  long lVar5;
  pointer this_00;
  idx_t iVar6;
  long lVar7;
  InvalidInputException *this_01;
  ulong uVar8;
  long lVar9;
  data_ptr_t pdVar10;
  unsigned_long val;
  WindowExecutorLocalState *this_02;
  ulong idx;
  long lVar11;
  WindowInputExpression ntile_col;
  WindowInputExpression local_70;
  data_ptr_t local_58;
  string local_50;
  
  this_02 = lstate + 2;
  pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_02,0);
  pdVar10 = pvVar4->data;
  pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_02,1);
  if (gstate[1].super_WindowExecutorState._vptr_WindowExecutorState != (_func_int **)0x0) {
    pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_02,6);
    pdVar10 = pvVar4->data;
    pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_02,7);
  }
  pdVar2 = pvVar4->data;
  local_58 = result->data;
  WindowInputExpression::WindowInputExpression
            (&local_70,eval_chunk,(this->super_WindowRowNumberExecutor).ntile_idx);
  if (count != 0) {
    idx = 0;
    do {
      pvVar4 = vector<duckdb::Vector,_true>::operator[](&(local_70.chunk)->data,local_70.col_idx);
      puVar3 = (pvVar4->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (local_70.scalar == true) {
        if ((puVar3 == (unsigned_long *)0x0) || ((*puVar3 & 1) != 0)) goto LAB_011a0f1e;
LAB_011a0f99:
        FlatVector::SetNull(result,idx,true);
      }
      else {
        if ((puVar3 != (unsigned_long *)0x0) && ((puVar3[idx >> 6] >> (idx & 0x3f) & 1) == 0))
        goto LAB_011a0f99;
LAB_011a0f1e:
        pvVar4 = vector<duckdb::Vector,_true>::operator[](&(local_70.chunk)->data,local_70.col_idx);
        uVar8 = idx;
        if (local_70.scalar != false) {
          uVar8 = 0;
        }
        lVar11 = *(long *)(pvVar4->data + uVar8 * 8);
        if (lVar11 < 1) {
          this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Argument for ntile must be greater than zero","");
          InvalidInputException::InvalidInputException(this_01,&local_50);
          __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        lVar5 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                          (*(long *)(pdVar2 + idx * 8) - *(long *)(pdVar10 + idx * 8));
        if (lVar5 <= lVar11) {
          lVar11 = lVar5;
        }
        if ((((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_> *)
             &gstate[1].super_WindowExecutorState)->_M_t).
            super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>
            .super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl ==
            (WindowTokenTree *)0x0) {
          val = row_idx - *(long *)(pdVar10 + idx * 8);
        }
        else {
          this_00 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                    ::operator->((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                                  *)(gstate + 1));
          iVar6 = WindowTokenTree::Rank
                            (this_00,*(idx_t *)(pdVar10 + idx * 8),*(idx_t *)(pdVar2 + idx * 8),
                             row_idx);
          val = iVar6 - 1;
        }
        lVar7 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
        lVar1 = lVar5 / lVar11 + 1;
        lVar9 = (lVar5 % lVar11) * lVar1;
        if (lVar7 < lVar9) {
          lVar7 = lVar7 / lVar1;
        }
        else {
          lVar7 = (lVar7 - lVar9) / (lVar5 / lVar11) + lVar5 % lVar11;
        }
        *(long *)(local_58 + idx * 8) = lVar7 + 1;
      }
      idx = idx + 1;
      row_idx = row_idx + 1;
    } while (count != idx);
  }
  return;
}

Assistant:

void WindowNtileExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                           DataChunk &eval_chunk, Vector &result, idx_t count, idx_t row_idx) const {
	auto &grstate = gstate.Cast<WindowRowNumberGlobalState>();
	auto &lrstate = lstate.Cast<WindowRowNumberLocalState>();
	auto partition_begin = FlatVector::GetData<const idx_t>(lrstate.bounds.data[PARTITION_BEGIN]);
	auto partition_end = FlatVector::GetData<const idx_t>(lrstate.bounds.data[PARTITION_END]);
	if (grstate.token_tree) {
		// With secondary sorts, we restrict to the frame boundaries, but everything else should compute the same.
		partition_begin = FlatVector::GetData<const idx_t>(lrstate.bounds.data[FRAME_BEGIN]);
		partition_end = FlatVector::GetData<const idx_t>(lrstate.bounds.data[FRAME_END]);
	}
	auto rdata = FlatVector::GetData<int64_t>(result);
	WindowInputExpression ntile_col(eval_chunk, ntile_idx);
	for (idx_t i = 0; i < count; ++i, ++row_idx) {
		if (ntile_col.CellIsNull(i)) {
			FlatVector::SetNull(result, i, true);
		} else {
			auto n_param = ntile_col.GetCell<int64_t>(i);
			if (n_param < 1) {
				throw InvalidInputException("Argument for ntile must be greater than zero");
			}
			// With thanks from SQLite's ntileValueFunc()
			auto n_total = NumericCast<int64_t>(partition_end[i] - partition_begin[i]);
			if (n_param > n_total) {
				// more groups allowed than we have values
				// map every entry to a unique group
				n_param = n_total;
			}
			int64_t n_size = (n_total / n_param);
			// find the row idx within the group
			D_ASSERT(row_idx >= partition_begin[i]);
			idx_t partition_idx = 0;
			if (grstate.token_tree) {
				partition_idx = grstate.token_tree->Rank(partition_begin[i], partition_end[i], row_idx) - 1;
			} else {
				partition_idx = row_idx - partition_begin[i];
			}
			auto adjusted_row_idx = NumericCast<int64_t>(partition_idx);

			// now compute the ntile
			int64_t n_large = n_total - n_param * n_size;
			int64_t i_small = n_large * (n_size + 1);
			int64_t result_ntile;

			D_ASSERT((n_large * (n_size + 1) + (n_param - n_large) * n_size) == n_total);

			if (adjusted_row_idx < i_small) {
				result_ntile = 1 + adjusted_row_idx / (n_size + 1);
			} else {
				result_ntile = 1 + n_large + (adjusted_row_idx - i_small) / n_size;
			}
			// result has to be between [1, NTILE]
			D_ASSERT(result_ntile >= 1 && result_ntile <= n_param);
			rdata[i] = result_ntile;
		}
	}
}